

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::coap::Message::GetAccept
          (Error *__return_storage_ptr__,Message *this,ContentFormat *aAcceptFormat)

{
  char cVar1;
  ContentFormat CVar2;
  _Base_ptr p_Var3;
  char *from;
  char *to;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar6;
  format_args args;
  writer write;
  writer local_b8;
  string local_b0;
  ErrorCode local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  p_Var3 = (this->mOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var4 = &(this->mOptions)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var4->_M_header;
    do {
      bVar6 = (ushort)(short)p_Var3[1]._M_color < 0x11;
      if (!bVar6) {
        p_Var5 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[bVar6];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var4) && ((ushort)(short)p_Var5[1]._M_color < 0x12)) {
      CVar2 = OptionValue::GetUint32Value((OptionValue *)&p_Var5[1]._M_parent);
      *aAcceptFormat = CVar2;
      return __return_storage_ptr__;
    }
  }
  local_68.types_[0] = none_type;
  from = "cannot find valid CoAP Accept option";
  local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
       "cannot find valid CoAP Accept option";
  local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x24;
  local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
  local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
  local_68.parse_funcs_[0] = (parse_func)0x0;
  local_b8.handler_ = &local_68;
  local_68.context_.types_ = local_68.types_;
  do {
    cVar1 = *from;
    to = from;
    while (cVar1 != '{') {
      to = to + 1;
      if (to == "") {
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_b8,from,"");
        goto LAB_001f3518;
      }
      cVar1 = *to;
    }
    ::fmt::v10::detail::
    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
    operator()(&local_b8,from,to);
    from = ::fmt::v10::detail::
           parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                     (to,"",&local_68);
  } while (from != "");
LAB_001f3518:
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_68;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_b0,(v10 *)"cannot find valid CoAP Accept option",(string_view)ZEXT816(0x24),args
            );
  local_90 = kNotFound;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
  __return_storage_ptr__->mCode = local_90;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_88);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::GetAccept(ContentFormat &aAcceptFormat) const
{
    Error error;

    auto option = GetOption(OptionType::kAccept);
    VerifyOrExit(option != nullptr, error = ERROR_NOT_FOUND("cannot find valid CoAP Accept option"));
    aAcceptFormat = utils::from_underlying<ContentFormat>(option->GetUint32Value());

exit:
    return error;
}